

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

void list_directory_from_sftp_print(fxp_name *name)

{
  char *local_18;
  char *san;
  fxp_name *name_local;
  
  local_18 = stripctrl_string(string_scc,name->longname);
  while (local_18 != (char *)0x0) {
    printf("%s\n",local_18);
    safefree(local_18);
    local_18 = (char *)0x0;
  }
  return;
}

Assistant:

void list_directory_from_sftp_print(struct fxp_name *name)
{
    with_stripctrl(san, name->longname)
        printf("%s\n", san);
}